

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O0

HT_Timeline *
ht_timeline_create(size_t buffer_capacity,HT_Boolean thread_safe,HT_Boolean serialize_events,
                  char *listeners,HT_ErrorCode *out_err)

{
  HT_Byte *pHVar1;
  HT_TimelineListenerContainer *pHVar2;
  HT_Mutex *pHVar3;
  HT_EventIdProvider *pHVar4;
  HT_Timeline *local_38;
  HT_Timeline *timeline;
  HT_ErrorCode error_code;
  HT_ErrorCode *out_err_local;
  char *listeners_local;
  HT_Boolean serialize_events_local;
  HT_Boolean thread_safe_local;
  size_t buffer_capacity_local;
  
  timeline._4_4_ = HT_ERR_OK;
  local_38 = (HT_Timeline *)ht_alloc(0x138);
  if (local_38 == (HT_Timeline *)0x0) goto LAB_0010d11f;
  pHVar1 = (HT_Byte *)ht_alloc(buffer_capacity);
  local_38->buffer = pHVar1;
  if (local_38->buffer == (HT_Byte *)0x0) {
    timeline._4_4_ = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    pHVar2 = ht_find_or_create_listener(listeners);
    local_38->listeners = pHVar2;
    if (local_38->listeners != (HT_TimelineListenerContainer *)0x0) {
      if (thread_safe == 0) {
        local_38->locking_policy = (_HT_Mutex *)0x0;
      }
      else {
        pHVar3 = ht_mutex_create();
        local_38->locking_policy = pHVar3;
        if (local_38->locking_policy == (_HT_Mutex *)0x0) {
          timeline._4_4_ = HT_ERR_OUT_OF_MEMORY;
          ht_timeline_listener_container_unref(local_38->listeners);
          goto LAB_0010d0fe;
        }
      }
      local_38->buffer_usage = 0;
      local_38->buffer_capacity = buffer_capacity;
      pHVar4 = ht_event_id_provider_get_default();
      local_38->id_provider = pHVar4;
      local_38->serialize_events = serialize_events;
      memset(local_38,0,0x100);
      goto LAB_0010d11f;
    }
    timeline._4_4_ = HT_ERR_CANT_CREATE_LISTENER_CONTAINER;
LAB_0010d0fe:
    ht_free(local_38->buffer);
  }
  ht_free(local_38);
  local_38 = (HT_Timeline *)0x0;
LAB_0010d11f:
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = timeline._4_4_;
  }
  return local_38;
}

Assistant:

HT_Timeline*
ht_timeline_create(size_t buffer_capacity,
                   HT_Boolean thread_safe,
                   HT_Boolean serialize_events,
                   const char* listeners,
                   HT_ErrorCode* out_err)
{
    HT_ErrorCode error_code = HT_ERR_OK;
    HT_Timeline* timeline = HT_CREATE_TYPE(HT_Timeline);

    if (timeline == NULL)
    {
        goto done;
    }

    timeline->buffer = (HT_Byte*)ht_alloc(buffer_capacity);

    if (timeline->buffer == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto error_allocate_buffer;
    }

    timeline->listeners = ht_find_or_create_listener(listeners);
    if (timeline->listeners == NULL)
    {
        error_code = HT_ERR_CANT_CREATE_LISTENER_CONTAINER;
        goto error_create_listener;
    }

    if (thread_safe)
    {
        timeline->locking_policy = ht_mutex_create();
        if (timeline->locking_policy == NULL)
        {
            error_code = HT_ERR_OUT_OF_MEMORY;
            goto error_locking_policy;
        }
    }
    else
    {
        timeline->locking_policy = NULL;
    }

    timeline->buffer_usage = 0;
    timeline->buffer_capacity = buffer_capacity;
    timeline->id_provider = ht_event_id_provider_get_default();
    timeline->serialize_events = serialize_events;
    memset(timeline->features, 0, sizeof(timeline->features));

    goto done;

error_locking_policy:
    ht_timeline_listener_container_unref(timeline->listeners);
error_create_listener:
    ht_free(timeline->buffer);
error_allocate_buffer:
    ht_free(timeline);
    timeline = NULL;
done:
    HT_SET_ERROR(out_err, error_code);

    return timeline;
}